

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O3

int filesrc_getByte(void *sourceData)

{
  int iVar1;
  FileSource *fin;
  
  if (*(int *)((long)sourceData + 0x18) != 0) {
    iVar1 = tidyBufPopByte((TidyBuffer *)((long)sourceData + 8));
    return iVar1;
  }
  iVar1 = fgetc(*sourceData);
  return iVar1;
}

Assistant:

static int TIDY_CALL filesrc_getByte( void* sourceData )
{
  FileSource* fin = (FileSource*) sourceData;
  int bv;
  if ( fin->unget.size > 0 )
    bv = tidyBufPopByte( &fin->unget );
  else
    bv = fgetc( fin->fp );
  return bv;
}